

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

bool jsoncons::jsonpath::detail::
     is_false<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *val)

{
  bool bVar1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar2;
  uint uVar3;
  string_view_type sVar4;
  
  pbVar2 = val;
  while (uVar3 = (byte)(pbVar2->field_0).json_const_pointer_ & 0xf, uVar3 - 8 < 2) {
    pbVar2 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&pbVar2->field_0 + 8);
  }
  if ((uVar3 == 0xe) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(val), bVar1
     )) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(val);
  if ((bVar1) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(val), bVar1
     )) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(val);
  pbVar2 = val;
  if ((!bVar1) ||
     (sVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                        (val), sVar4._M_len != 0)) {
    while (uVar3 = (byte)(pbVar2->field_0).json_const_pointer_ & 0xf, uVar3 - 8 < 2) {
      pbVar2 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar2->field_0 + 8);
    }
    if ((uVar3 == 1) &&
       (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(val),
       !bVar1)) {
      return true;
    }
    while ((*(byte *)&val->field_0 & 0xf) - 8 < 2) {
      val = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
             ((long)&val->field_0 + 8);
    }
    if ((*(byte *)&val->field_0 & 0xf) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_false(const Json& val)
    {
        return ((val.is_array() && val.empty()) ||
                 (val.is_object() && val.empty()) ||
                 (val.is_string() && val.as_string_view().empty()) ||
                 (val.is_bool() && !val.as_bool()) ||
                 val.is_null());
    }